

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O2

hwaddr ppc_hash32_bat_lookup(PowerPCCPU_conflict3 *cpu,target_ulong ea,int rwx,int *prot)

{
  powerpc_mmu_t pVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar7 = 0;
  do {
    if ((cpu->env).nb_BATs == uVar7) {
      return 0xffffffffffffffff;
    }
    uVar2 = (cpu->env).DBAT[(ulong)(rwx == 2) * 2][uVar7];
    uVar3 = (cpu->env).DBAT[(ulong)(rwx == 2) * 2 + 1][uVar7];
    pVar1 = (cpu->env).mmu_model;
    uVar5 = (uint)uVar2;
    uVar6 = (uint)uVar3;
    if (pVar1 == POWERPC_MMU_601) {
      if ((uVar3 & 0x40) != 0) {
        uVar8 = (uVar6 & 0x3f) << 0x11;
        goto LAB_00a3b6ee;
      }
    }
    else {
      uVar4 = (cpu->env).msr;
      if ((((uVar2 & 1) == 0 & (byte)(((uint)uVar4 & 0x4000) >> 0xe)) == 0) &&
         ((uVar4 & 0x4000) != 0 || (uVar2 & 2) != 0)) {
        uVar8 = (uVar5 & 0x1ffc) << 0xf;
LAB_00a3b6ee:
        if (((uint)ea & (uVar8 ^ 0xfffe0000)) == (uVar5 & 0xfffe0000)) {
          if (pVar1 == POWERPC_MMU_601) {
            uVar5 = ppc_hash32_pp_prot((uint)((uVar5 >> (((uint)(cpu->env).msr >> 0xe & 1) == 0 | 2U
                                                        ) & 1) != 0),uVar5 & 3,0);
          }
          else {
            uVar5 = (uint)((uVar6 & 3) == 2) * 2 + 5;
            if ((uVar3 & 3) == 0) {
              uVar5 = uVar6 & 3;
            }
          }
          *prot = uVar5;
          return (ulong)((uVar8 ^ 0xfffe0000) & uVar6) | ((ulong)uVar8 | 0xffffffff0001f000) & ea;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static hwaddr ppc_hash32_bat_lookup(PowerPCCPU *cpu, target_ulong ea, int rwx,
                                    int *prot)
{
    CPUPPCState *env = &cpu->env;
    target_ulong *BATlt, *BATut;
    int i;

    LOG_BATS("%s: %cBAT v " TARGET_FMT_lx "\n", __func__,
             rwx == 2 ? 'I' : 'D', ea);
    if (rwx == 2) {
        BATlt = env->IBAT[1];
        BATut = env->IBAT[0];
    } else {
        BATlt = env->DBAT[1];
        BATut = env->DBAT[0];
    }
    for (i = 0; i < env->nb_BATs; i++) {
        target_ulong batu = BATut[i];
        target_ulong batl = BATlt[i];
        target_ulong mask;

        if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
            mask = hash32_bat_601_size(cpu, batu, batl);
        } else {
            mask = hash32_bat_size(cpu, batu, batl);
        }
        LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                 " BATl " TARGET_FMT_lx "\n", __func__,
                 type == ACCESS_CODE ? 'I' : 'D', i, ea, batu, batl);

        if (mask && ((ea & mask) == (batu & BATU32_BEPI))) {
            hwaddr raddr = (batl & mask) | (ea & ~mask);

            if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
                *prot = hash32_bat_601_prot(cpu, batu, batl);
            } else {
                *prot = hash32_bat_prot(cpu, batu, batl);
            }

            return raddr & TARGET_PAGE_MASK;
        }
    }

    /* No hit */
#if defined(DEBUG_BATS)
    if (qemu_log_enabled()) {
        LOG_BATS("no BAT match for " TARGET_FMT_lx ":\n", ea);
        for (i = 0; i < 4; i++) {
            BATu = &BATut[i];
            BATl = &BATlt[i];
            BEPIu = *BATu & BATU32_BEPIU;
            BEPIl = *BATu & BATU32_BEPIL;
            bl = (*BATu & 0x00001FFC) << 15;
            LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                     " BATl " TARGET_FMT_lx "\n\t" TARGET_FMT_lx " "
                     TARGET_FMT_lx " " TARGET_FMT_lx "\n",
                     __func__, type == ACCESS_CODE ? 'I' : 'D', i, ea,
                     *BATu, *BATl, BEPIu, BEPIl, bl);
        }
    }
#endif

    return -1;
}